

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O1

void textblock_vappend_c(textblock *tb,uint8_t attr,char *fmt,__va_list_tag *vp)

{
  char *buf;
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  va_list args;
  __va_list_tag local_48;
  
  sVar2 = 0x80;
  buf = (char *)mem_zalloc(0x80);
  while( true ) {
    local_48.reg_save_area = vp->reg_save_area;
    local_48.gp_offset = vp->gp_offset;
    local_48.fp_offset = vp->fp_offset;
    local_48.overflow_arg_area = vp->overflow_arg_area;
    sVar1 = vstrnfmt(buf,sVar2,fmt,&local_48);
    if (sVar1 < sVar2 - 1) break;
    sVar2 = sVar2 + 0x80;
    buf = (char *)mem_realloc(buf,sVar2);
  }
  sVar2 = text_mbstowcs((wchar_t *)0x0,buf,L'\0');
  uVar3 = (uint)sVar2;
  if ((int)uVar3 < 0) {
    __assert_fail("new_length >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-textblock.c"
                  ,0x7e,
                  "void textblock_vappend_c(textblock *, uint8_t, const char *, struct __va_list_tag *)"
                 );
  }
  textblock_resize_if_needed(tb,(ulong)(uVar3 + 1));
  text_mbstowcs(tb->text + tb->strlen,buf,(int)tb->size - (int)tb->strlen);
  memset(tb->attrs + tb->strlen,(uint)attr,(ulong)(uVar3 & 0x7fffffff));
  tb->strlen = tb->strlen + (ulong)(uVar3 & 0x7fffffff);
  mem_free(buf);
  return;
}

Assistant:

static void textblock_vappend_c(textblock *tb, uint8_t attr, const char *fmt,
		va_list vp)
{
	size_t temp_len = TEXTBLOCK_LEN_INITIAL;
	char *temp_space = mem_zalloc(temp_len);
	int new_length;

	/* We have to format the incoming string in native (external) format
	 * re-allocating the temporary space as necessary. Once it's been
	 * successfully formatted, we can then do the conversion to wide chars
	 */
	while (1) {
		va_list args;
		size_t len;

		va_copy(args, vp);
		len = vstrnfmt(temp_space, temp_len, fmt, args);
		va_end(args);
		if (len < temp_len - 1) {
			/* Not using all space, therefore it completed */
			break;
		}

		temp_len = TEXTBLOCK_LEN_INCR(temp_len);
		temp_space = mem_realloc(temp_space, temp_len * sizeof *temp_space);
	}

	/* Get extent of addition in wide chars */
	new_length = text_mbstowcs(NULL, temp_space, 0);
	assert(new_length >= 0); /* If this fails, the string was badly formed */
	textblock_resize_if_needed(tb, new_length + 1);

	/* Convert to wide chars, into the text block buffer */
	text_mbstowcs(tb->text + tb->strlen, temp_space, tb->size - tb->strlen);
	memset(tb->attrs + tb->strlen, attr, new_length);
	tb->strlen += new_length;
	mem_free(temp_space);
}